

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  bool bVar1;
  int y;
  int lodOffsNdx;
  long lVar2;
  Vec3 *s;
  Vec3 *s_00;
  Vec4 *b;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float wy;
  float fVar7;
  float fVar8;
  float width;
  float height;
  Texture2DView TVar9;
  Vec2 coordDxo;
  Vec2 clampedLod;
  Vec2 lodO;
  Vec2 coordDx;
  Vec2 lodBounds;
  Vec2 coordDy;
  Vec2 lodBias;
  Vec2 coord;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triT [2];
  Vec3 triS [2];
  Texture2DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  undefined1 local_1c0 [16];
  Vector<float,_2> local_1b0;
  ulong local_1a8;
  undefined8 local_1a0;
  int local_198;
  float local_194;
  float local_190;
  float local_18c;
  ReferenceParams *local_188;
  Vector<int,_2> local_180;
  Vector<bool,_4> local_178;
  float local_174;
  Vector<float,_2> local_170;
  float local_168;
  float local_164;
  Vector<float,_2> local_160;
  PixelBufferAccess *local_158;
  Vec4 *local_150;
  ConstPixelBufferAccess *local_148;
  ConstPixelBufferAccess *local_140;
  Vec4 *local_138;
  Vector<float,_2> local_130;
  undefined1 local_128 [16];
  Vector<float,_4> local_118;
  Vec4 local_108;
  Vec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  Sampler *local_b8;
  Vec4 *local_b0;
  Texture2DView local_a8;
  undefined1 local_98 [8];
  ConstPixelBufferAccess *pCStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec3 local_78;
  float fStack_6c;
  undefined8 local_68;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_58;
  Vector<float,_2> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158 = errorMask;
  TVar9 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  pCStack_90 = TVar9.m_levels;
  local_98._0_4_ = TVar9.m_numLevels;
  local_b8 = &sampleParams->sampler;
  local_188 = sampleParams;
  TVar9 = tcu::getEffectiveTextureView
                    ((Texture2DView *)local_98,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&local_58,local_b8);
  local_a8.m_levels = TVar9.m_levels;
  local_a8.m_numLevels = TVar9.m_numLevels;
  local_d8.m_data[0] = *texCoord;
  local_f8.m_data[0] = texCoord[1];
  local_d8.m_data[1] = texCoord[2];
  local_d8.m_data[2] = texCoord[4];
  local_cc = texCoord[6];
  local_f8.m_data[1] = texCoord[3];
  local_f8.m_data[2] = texCoord[5];
  local_ec = texCoord[7];
  local_180.m_data[0] = 0;
  local_180.m_data[1] = 0;
  if (0 < local_a8.m_numLevels) {
    local_180.m_data = *(int (*) [2])((local_a8.m_levels)->m_size).m_data;
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_78.m_data[0] = (local_188->super_RenderParams).w.m_data[0];
  local_78.m_data[1] = (local_188->super_RenderParams).w.m_data[1];
  local_78.m_data[2] = (local_188->super_RenderParams).w.m_data[2];
  fStack_6c = (local_188->super_RenderParams).w.m_data[3];
  local_68 = CONCAT44(local_78.m_data[1],local_78.m_data[2]);
  local_130.m_data[0] = 0.0;
  if (((local_188->super_RenderParams).flags & 2) != 0) {
    local_130.m_data[0] = (local_188->super_RenderParams).bias;
  }
  local_98 = (undefined1  [8])0xbf800000;
  pCStack_90 = (ConstPixelBufferAccess *)0x3f800000;
  local_88 = 0xbf80000000000000;
  uStack_80 = 0x3f80000000000000;
  local_118.m_data[0] = -1.7146522e+38;
  local_130.m_data[1] = local_130.m_data[0];
  local_e8 = local_f8.m_data[2];
  local_e4 = local_f8.m_data[1];
  local_c8 = local_d8.m_data[2];
  local_c4 = local_d8.m_data[1];
  tcu::RGBA::toVec((RGBA *)&local_118);
  tcu::clear(local_158,&local_108);
  b = &(local_188->super_RenderParams).colorBias;
  local_138 = &(local_188->super_RenderParams).colorScale;
  local_b0 = &lookupPrec->colorThreshold;
  local_198 = 0;
  local_150 = b;
  local_148 = result;
  local_140 = reference;
  for (local_1a8 = 0; (int)local_1a8 < (result->m_size).m_data[1];
      local_1a8 = (ulong)((int)local_1a8 + 1)) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    wy = (float)(int)local_1a8 + 0.5;
    local_194 = wy / height;
    local_164 = height - wy;
    local_168 = 1.0 - local_194;
    for (y = 0; y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1c0,(int)result,y,(int)local_1a8);
      tcu::operator-((tcu *)&local_118,(Vector<float,_4> *)local_1c0,b);
      tcu::operator/((tcu *)&local_108,&local_118,local_138);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_128,(int)reference,y,(int)local_1a8);
      tcu::operator-((tcu *)local_1c0,(Vector<float,_4> *)local_128,b);
      tcu::operator/((tcu *)&local_118,(Vector<float,_4> *)local_1c0,local_138);
      tcu::operator-((tcu *)local_128,&local_108,&local_118);
      tcu::abs<float,4>((tcu *)local_1c0,(Vector<float,_4> *)local_128);
      tcu::lessThanEqual<float,4>((tcu *)&local_178,(Vector<float,_4> *)local_1c0,local_b0);
      bVar1 = tcu::boolAll<4>(&local_178);
      if (!bVar1) {
        fVar8 = (float)y + 0.5;
        fVar7 = fVar8 / width;
        bVar1 = 1.0 <= local_194 + fVar7;
        fVar6 = local_194;
        local_18c = fVar8;
        local_190 = wy;
        if (bVar1) {
          fVar7 = 1.0 - fVar7;
          fVar6 = local_168;
          local_18c = width - fVar8;
          local_190 = local_164;
        }
        s = &local_d8 + bVar1;
        w = &local_78 + bVar1;
        fVar5 = projectedTriInterpolate(s,w,fVar7,fVar6);
        s_00 = &local_f8 + bVar1;
        local_128._4_4_ = projectedTriInterpolate(s_00,w,fVar7,fVar6);
        local_128._0_4_ = fVar5;
        fVar5 = triDerivateX(s,w,fVar8,width,fVar6);
        local_1c0._4_4_ = triDerivateX(s_00,w,fVar8,width,fVar6);
        local_1c0._0_4_ = fVar5;
        tcu::Vector<int,_2>::cast<float>(&local_180);
        tcu::operator*((Vector<float,_2> *)local_1c0,&local_160);
        fVar6 = triDerivateY(s,w,wy,height,fVar7);
        local_1c0._4_4_ = triDerivateY(s_00,w,wy,height,fVar7);
        local_1c0._0_4_ = fVar6;
        tcu::Vector<int,_2>::cast<float>(&local_180);
        tcu::operator*((Vector<float,_2> *)local_1c0,&local_170);
        tcu::computeLodBoundsFromDerivates
                  ((tcu *)&local_170,(float)local_178.m_data,local_174,local_160.m_data[0],
                   local_160.m_data[1],lodPrec);
        for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
          fVar6 = *(float *)(local_98 + lVar2 * 8) + local_18c;
          fVar8 = *(float *)(local_98 + lVar2 * 8 + 4) + local_190;
          fVar7 = triDerivateX(s,w,fVar6,width,fVar8 / height);
          local_1b0.m_data[1] = triDerivateX(s_00,w,fVar6,width,fVar8 / height);
          local_1b0.m_data[0] = fVar7;
          tcu::Vector<int,_2>::cast<float>(&local_180);
          tcu::operator*(&local_1b0,(Vector<float,_2> *)&local_1a0);
          fVar7 = triDerivateY(s,w,fVar8,height,fVar6 / width);
          fVar6 = triDerivateY(s_00,w,fVar8,height,fVar6 / width);
          local_1a0 = (void *)CONCAT44(fVar6,fVar7);
          tcu::Vector<int,_2>::cast<float>(&local_180);
          tcu::operator*((Vector<float,_2> *)&local_1a0,&local_38);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&local_1a0,(float)local_1c0._0_4_,(float)local_1c0._4_4_,
                     local_1b0.m_data[0],local_1b0.m_data[1],lodPrec);
          fVar6 = (float)((ulong)local_1a0 >> 0x20);
          uVar3 = -(uint)(local_170.m_data[0] <= SUB84(local_1a0,0));
          uVar4 = -(uint)(fVar6 <= local_170.m_data[1]);
          local_170.m_data[0] =
               (float)(~uVar3 & (uint)SUB84(local_1a0,0) | (uint)local_170.m_data[0] & uVar3);
          local_170.m_data[1] = (float)(~uVar4 & (uint)fVar6 | (uint)local_170.m_data[1] & uVar4);
        }
        tcu::operator+(&local_170,&local_130);
        local_1a0 = *(void **)&local_188->minLod;
        tcu::clampLodBounds((tcu *)&local_1b0,(Vec2 *)local_1c0,(Vec2 *)&local_1a0,lodPrec);
        bVar1 = tcu::isLookupResultValid
                          (&local_a8,local_b8,lookupPrec,(Vec2 *)local_128,(Vec2 *)&local_1b0,
                           &local_108);
        result = local_148;
        reference = local_140;
        b = local_150;
        if (!bVar1) {
          local_1a0 = (void *)CONCAT44(local_1a0._4_4_,0xff0000ff);
          tcu::RGBA::toVec((RGBA *)&local_1a0);
          reference = local_140;
          result = local_148;
          b = local_150;
          tcu::PixelBufferAccess::setPixel(local_158,(Vec4 *)local_1c0,y,(int)local_1a8,0);
          local_198 = local_198 + 1;
        }
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_58);
  return local_198;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec2							srcSize				= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}